

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,DefinitionSymbol *args,
          SourceRange *args_1)

{
  SourceLocation *pSVar1;
  size_type sVar2;
  ulong uVar3;
  undefined8 *puVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  DefinitionSymbol *pDVar7;
  ConfigRule *pCVar8;
  pointer pTVar9;
  pointer pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  EVP_PKEY_CTX *pEVar13;
  EVP_PKEY_CTX *ctx;
  long lVar14;
  pointer pTVar15;
  
  pTVar15 = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar5 = args_1->startLoc;
    SVar6 = args_1->endLoc;
    pTVar15->definition = args;
    pTVar15->rule = (ConfigRule *)0x0;
    (pTVar15->sourceRange).startLoc = SVar5;
    (pTVar15->sourceRange).endLoc = SVar6;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar13 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar13 < ctx) {
    pEVar13 = ctx;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    pEVar13 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar14 = (long)pTVar15 - (long)this->data_;
  pTVar9 = (pointer)operator_new((long)pEVar13 << 5);
  *(DefinitionSymbol **)((long)pTVar9 + lVar14) = args;
  *(undefined8 *)((long)pTVar9 + lVar14 + 8) = 0;
  SVar5 = args_1->endLoc;
  pSVar1 = (SourceLocation *)((long)pTVar9 + lVar14 + 0x10);
  *pSVar1 = args_1->startLoc;
  pSVar1[1] = SVar5;
  pTVar12 = this->data_;
  pTVar10 = pTVar12 + this->len;
  pTVar11 = pTVar9;
  if (pTVar10 == pTVar15) {
    for (; pTVar12 != pTVar15; pTVar12 = pTVar12 + 1) {
      pDVar7 = pTVar12->definition;
      pCVar8 = pTVar12->rule;
      SVar5 = (pTVar12->sourceRange).endLoc;
      (pTVar11->sourceRange).startLoc = (pTVar12->sourceRange).startLoc;
      (pTVar11->sourceRange).endLoc = SVar5;
      pTVar11->definition = pDVar7;
      pTVar11->rule = pCVar8;
      pTVar11 = pTVar11 + 1;
    }
  }
  else {
    for (; pTVar12 != pTVar15; pTVar12 = pTVar12 + 1) {
      pDVar7 = pTVar12->definition;
      pCVar8 = pTVar12->rule;
      SVar5 = (pTVar12->sourceRange).endLoc;
      (pTVar11->sourceRange).startLoc = (pTVar12->sourceRange).startLoc;
      (pTVar11->sourceRange).endLoc = SVar5;
      pTVar11->definition = pDVar7;
      pTVar11->rule = pCVar8;
      pTVar11 = pTVar11 + 1;
    }
    puVar4 = (undefined8 *)((long)pTVar9 + lVar14);
    for (; pTVar15 != pTVar10; pTVar15 = pTVar15 + 1) {
      pDVar7 = pTVar15->definition;
      pCVar8 = pTVar15->rule;
      SVar5 = (pTVar15->sourceRange).endLoc;
      *(SourceLocation *)(puVar4 + 6) = (pTVar15->sourceRange).startLoc;
      *(SourceLocation *)(puVar4 + 7) = SVar5;
      puVar4[4] = pDVar7;
      puVar4[5] = pCVar8;
      puVar4 = puVar4 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar13;
  this->data_ = pTVar9;
  return (reference)((long)pTVar9 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }